

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedRead::BlockedRead
          (BlockedRead *this,PromiseFulfiller<unsigned_int> *fulfiller,AsyncPipe *pipe,
          ArrayPtr<unsigned_char> readBuffer,size_t minBytes)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  size_t minBytes_local;
  AsyncPipe *pipe_local;
  PromiseFulfiller<unsigned_int> *fulfiller_local;
  BlockedRead *this_local;
  ArrayPtr<unsigned_char> readBuffer_local;
  
  AsyncIoStream::AsyncIoStream(&this->super_AsyncIoStream);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_007d9f90;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&DAT_007da010;
  this->fulfiller = fulfiller;
  this->pipe = pipe;
  (this->readBuffer).ptr = readBuffer.ptr;
  (this->readBuffer).size_ = readBuffer.size_;
  this->minBytes = minBytes;
  this->readSoFar = 0;
  Canceler::Canceler(&this->canceler);
  bVar1 = Maybe<kj::AsyncIoStream_&>::operator==(&pipe->state,(void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x261,FAILED,"pipe.state == nullptr","");
    _::Debug::Fault::fatal(&local_50);
  }
  Maybe<kj::AsyncIoStream_&>::operator=(&pipe->state,&this->super_AsyncIoStream);
  return;
}

Assistant:

BlockedRead(PromiseFulfiller<size_t>& fulfiller, AsyncPipe& pipe,
                ArrayPtr<byte> readBuffer, size_t minBytes)
        : fulfiller(fulfiller), pipe(pipe), readBuffer(readBuffer), minBytes(minBytes) {
      KJ_REQUIRE(pipe.state == nullptr);
      pipe.state = *this;
    }